

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O1

void __thiscall Json_TwoKeywords_Test::TestBody(Json_TwoKeywords_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  string res;
  parser<json_out_callbacks> p;
  coord local_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  coord local_118;
  error_category *local_110;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  parser<json_out_callbacks> local_c8;
  
  local_d8._8_8_ = 0;
  local_e8._8_8_ = 0;
  local_d8._M_allocated_capacity = 0;
  local_e8._M_allocated_capacity = (size_type)&local_d8;
  pstore::json::parser<json_out_callbacks>::parser(&local_c8,(json_out_callbacks *)&local_e8,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_allocated_capacity != &local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
  }
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 0x10);
  local_108._16_8_ = 0x6166206575727420;
  local_108._24_4_ = 0x2065736c;
  local_108._8_8_ = 0xc;
  local_108[0x1c] = '\0';
  local_108._0_8_ = pbVar1;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_128,0xc);
  local_120 = pbVar1;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_c8,(span<const_char,__1L> *)local_128);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_ != pbVar1
     ) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_((result_type *)local_108,&local_c8);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            ((internal *)local_128,"res","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
             (char (*) [1])0x18f79c);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if (local_118 != (coord)0x0) {
      (**(code **)(*(long *)local_118 + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_110 = pstore::json::get_error_category();
  local_118.column = 0xc;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_128,"p.last_error ()",
             "make_error_code (json::error_code::unexpected_extra_input)",&local_c8.error_,
             (error_code *)&local_118);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if (local_118 != (coord)0x0) {
      (**(code **)(*(long *)local_118 + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_118 = local_c8.coordinate_;
  local_130.column = 7;
  local_130.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_128,"p.coordinate ()","(json::coord{7U, 1U})",&local_118,&local_130);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if (local_118 != (coord)0x0) {
      (**(code **)(*(long *)local_118 + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_ != pbVar1
     ) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.string_._M_dataplus._M_p != &local_c8.string_.field_2) {
    operator_delete(local_c8.string_._M_dataplus._M_p,
                    local_c8.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.callbacks_.out_._M_dataplus._M_p != &local_c8.callbacks_.out_.field_2) {
    operator_delete(local_c8.callbacks_.out_._M_dataplus._M_p,
                    local_c8.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_c8.stack_.c);
  if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )local_c8.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_c8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (Json, TwoKeywords) {
    json::parser<json_out_callbacks> p;
    p.input (" true false "s);
    std::string const res = p.eof ();
    EXPECT_EQ (res, "");
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unexpected_extra_input));
    EXPECT_EQ (p.coordinate (), (json::coord{7U, 1U}));
}